

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_initiate_shutdown(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_entity **pplStack_20;
  int i;
  olsrv2_routing_entry *e_it;
  olsrv2_routing_entry *entry;
  
  _initiate_shutdown = true;
  _freeze_routes = false;
  for (__tempptr._4_4_ = 0; __tempptr._4_4_ < 4; __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    plVar1 = _routing_tree[__tempptr._4_4_].list_head.next;
    e_it = (olsrv2_routing_entry *)&plVar1[-0x17].prev;
    plVar1 = plVar1->next;
    while( true ) {
      pplStack_20 = &plVar1[-0x17].prev;
      if ((e_it->_node).list.prev == _routing_tree[__tempptr._4_4_].list_head.prev) break;
      (e_it->route).cb_finished = (_func_void_os_route_ptr_int *)0x0;
      os_routing_linux_interrupt(e_it);
      (e_it->route).cb_finished = _cb_route_finished;
      if ((e_it->set & 1U) != 0) {
        e_it->set = false;
        _add_route_to_kernel_queue(e_it);
      }
      e_it = (olsrv2_routing_entry *)pplStack_20;
      plVar1 = plVar1->next;
    }
  }
  _process_kernel_queue();
  return;
}

Assistant:

void
olsrv2_routing_initiate_shutdown(void) {
  struct olsrv2_routing_entry *entry, *e_it;
  int i;

  /* remember we are in shutdown */
  _initiate_shutdown = true;
  _freeze_routes = false;

  /* remove all routes */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_for_each_element_safe(&_routing_tree[i], entry, _node, e_it) {
      /* stop internal route processing */
      entry->route.cb_finished = NULL;
      os_routing_interrupt(&entry->route);
      entry->route.cb_finished = _cb_route_finished;

      if (entry->set) {
        entry->set = false;
        _add_route_to_kernel_queue(entry);
      }
    }
  }

  _process_kernel_queue();
}